

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O2

cx_string<6UL>
mserialize::cx_strcat<2ul,1ul,1ul,2ul>
          (cx_string<2UL> *strings,cx_string<1UL> *strings_1,cx_string<1UL> *strings_2,
          cx_string<2UL> *strings_3)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  char buffer [7];
  cx_string<6UL> local_70;
  ulong auStack_68 [6];
  long lStack_38;
  cx_string<2UL> *local_30;
  cx_string<1UL> *local_28;
  cx_string<1UL> *local_20;
  cx_string<2UL> *local_18;
  
  pcVar1 = buffer;
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  local_30 = strings;
  local_28 = strings_1;
  local_20 = strings_2;
  local_18 = strings_3;
  auStack_68[1] = 2;
  auStack_68[2] = 1;
  auStack_68[3] = 1;
  auStack_68[4] = 2;
  for (lVar2 = 1; lVar2 != 5; lVar2 = lVar2 + 1) {
    for (uVar3 = 0; uVar3 < auStack_68[lVar2]; uVar3 = uVar3 + 1) {
      pcVar1[uVar3] = *(undefined1 *)((&lStack_38)[lVar2] + uVar3);
    }
    pcVar1 = pcVar1 + uVar3;
  }
  cx_string<6UL>::cx_string(&local_70,buffer);
  return (cx_string<6UL>)local_70._data;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}